

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O2

void * lj_alloc_malloc(void *msp,size_t nsize)

{
  ulong *puVar1;
  byte *pbVar2;
  int iVar3;
  void *pvVar4;
  undefined1 (*addr) [16];
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  int *piVar9;
  void *pvVar10;
  ulong *puVar11;
  msegmentptr pmVar12;
  size_t dvs;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  undefined1 (*pauVar16) [16];
  uint uVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  undefined8 *puVar20;
  long *plVar21;
  long lVar22;
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  undefined8 *puVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  if (nsize < 0xf1) {
    uVar14 = 0x20;
    if (0x16 < nsize) {
      uVar14 = (ulong)((int)nsize + 0xfU & 0x1f8);
    }
    uVar15 = *msp;
    bVar23 = (byte)(uVar14 >> 3);
    uVar17 = uVar15 >> (bVar23 & 0x1f);
    if ((uVar17 & 3) != 0) {
      uVar17 = (~uVar17 & 1) + (int)(uVar14 >> 3);
      lVar13 = (long)msp + (ulong)(uVar17 * 0x10) + 0x38;
      lVar29 = *(long *)((long)msp + (ulong)(uVar17 * 0x10) + 0x48);
      lVar28 = *(long *)(lVar29 + 0x10);
      if (lVar13 == lVar28) {
        *(uint *)msp = uVar15 & ~(1 << (uVar17 & 0x1f));
      }
      else {
        *(long *)((long)msp + (ulong)(uVar17 * 0x10) + 0x48) = lVar28;
        *(long *)(lVar28 + 0x18) = lVar13;
      }
      *(ulong *)(lVar29 + 8) = (ulong)(uVar17 * 8) + 3;
      pbVar2 = (byte *)(lVar29 + 8 + (ulong)(uVar17 * 8));
      *pbVar2 = *pbVar2 | 1;
      return (void *)(lVar29 + 0x10);
    }
    uVar8 = *(ulong *)((long)msp + 8);
    if (uVar8 < uVar14) {
      if (uVar15 >> (bVar23 & 0x1f) != 0) {
        uVar24 = 2 << (bVar23 & 0x1f);
        uVar24 = (-uVar24 | uVar24) & uVar17 << (bVar23 & 0x1f);
        uVar17 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
          }
        }
        uVar24 = uVar17 << 4;
        lVar13 = (long)msp + (ulong)uVar24 + 0x38;
        lVar29 = *(long *)((long)msp + (ulong)uVar24 + 0x48);
        lVar28 = *(long *)(lVar29 + 0x10);
        if (lVar13 == lVar28) {
          uVar15 = uVar15 & ~(1 << (uVar17 & 0x1f));
          *(uint *)msp = uVar15;
        }
        else {
          *(long *)((long)msp + (ulong)uVar24 + 0x48) = lVar28;
          *(long *)(lVar28 + 0x18) = lVar13;
        }
        uVar25 = (ulong)(uVar17 * 8);
        uVar18 = uVar25 - uVar14;
        if (0x1f < uVar18) {
          *(ulong *)(lVar29 + 8) = uVar14 | 3;
          *(ulong *)(lVar29 + 8 + uVar14) = uVar18 | 1;
          *(ulong *)(lVar29 + uVar25) = uVar18;
          if (uVar8 != 0) {
            lVar28 = *(long *)((long)msp + 0x18);
            uVar8 = uVar8 >> 3;
            lVar13 = (long)msp + uVar8 * 0x10 + 0x38;
            if ((uVar15 >> ((uint)uVar8 & 0x1f) & 1) == 0) {
              *(uint *)msp = uVar15 | 1 << ((byte)uVar8 & 0x1f);
              lVar27 = lVar13;
            }
            else {
              lVar27 = *(long *)(lVar13 + 0x10);
            }
            *(long *)(lVar13 + 0x10) = lVar28;
            *(long *)(lVar27 + 0x18) = lVar28;
            *(long *)(lVar28 + 0x10) = lVar27;
            *(long *)(lVar28 + 0x18) = lVar13;
          }
          *(ulong *)((long)msp + 8) = uVar18;
          *(ulong *)((long)msp + 0x18) = lVar29 + uVar14;
          return (void *)(lVar29 + 0x10);
        }
        *(ulong *)(lVar29 + 8) = uVar25 | 3;
        pbVar2 = (byte *)(lVar29 + 8 + uVar25);
        *pbVar2 = *pbVar2 | 1;
        return (void *)(lVar29 + 0x10);
      }
      uVar17 = *(uint *)((long)msp + 4);
      if (uVar17 != 0) {
        uVar24 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        lVar28 = *(long *)((long)msp + (ulong)uVar24 * 8 + 0x248);
        uVar18 = (*(ulong *)(lVar28 + 8) & 0xfffffffffffffffc) - uVar14;
        lVar29 = lVar28;
        while ((lVar13 = *(long *)(lVar28 + 0x20), lVar13 != 0 ||
               (lVar13 = *(long *)(lVar28 + 0x28), lVar13 != 0))) {
          uVar25 = (*(ulong *)(lVar13 + 8) & 0xfffffffffffffffc) - uVar14;
          lVar28 = lVar13;
          if (uVar25 < uVar18) {
            uVar18 = uVar25;
            lVar29 = lVar13;
          }
        }
        lVar28 = *(long *)(lVar29 + 0x18);
        lVar13 = *(long *)(lVar29 + 0x30);
        if (lVar28 == lVar29) {
          if (*(long *)(lVar29 + 0x28) == 0) {
            if (*(long *)(lVar29 + 0x20) == 0) {
              lVar28 = 0;
              goto LAB_0013b75c;
            }
            lVar27 = *(long *)(lVar29 + 0x20);
            puVar20 = (undefined8 *)(lVar29 + 0x20);
          }
          else {
            lVar27 = *(long *)(lVar29 + 0x28);
            puVar20 = (undefined8 *)(lVar29 + 0x28);
          }
          do {
            do {
              puVar26 = puVar20;
              lVar28 = lVar27;
              lVar27 = *(long *)(lVar28 + 0x28);
              puVar20 = (undefined8 *)(lVar28 + 0x28);
            } while (*(long *)(lVar28 + 0x28) != 0);
            lVar27 = *(long *)(lVar28 + 0x20);
            puVar20 = (undefined8 *)(lVar28 + 0x20);
          } while (*(long *)(lVar28 + 0x20) != 0);
          *puVar26 = 0;
        }
        else {
          lVar27 = *(long *)(lVar29 + 0x10);
          *(long *)(lVar27 + 0x18) = lVar28;
          *(long *)(lVar28 + 0x10) = lVar27;
        }
LAB_0013b75c:
        if (lVar13 != 0) {
          lVar27 = *(long *)(lVar29 + 0x38);
          if (lVar29 == *(long *)((long)msp + lVar27 * 8 + 0x248)) {
            *(long *)((long)msp + lVar27 * 8 + 0x248) = lVar28;
            if (lVar28 != 0) goto LAB_0013b791;
            *(uint *)((long)msp + 4) = uVar17 & ~(1 << ((uint)lVar27 & 0x1f));
          }
          else {
            *(long *)(lVar13 + 0x20 + (ulong)(*(long *)(lVar13 + 0x20) != lVar29) * 8) = lVar28;
            if (lVar28 != 0) {
LAB_0013b791:
              *(long *)(lVar28 + 0x30) = lVar13;
              lVar13 = *(long *)(lVar29 + 0x20);
              if (lVar13 != 0) {
                *(long *)(lVar28 + 0x20) = lVar13;
                *(long *)(lVar13 + 0x30) = lVar28;
              }
              lVar13 = *(long *)(lVar29 + 0x28);
              if (lVar13 != 0) {
                *(long *)(lVar28 + 0x28) = lVar13;
                *(long *)(lVar13 + 0x30) = lVar28;
              }
            }
          }
        }
        if (uVar18 < 0x20) {
          *(ulong *)(lVar29 + 8) = uVar18 + uVar14 | 3;
          pbVar2 = (byte *)(lVar29 + 8 + uVar18 + uVar14);
          *pbVar2 = *pbVar2 | 1;
        }
        else {
          *(ulong *)(lVar29 + 8) = uVar14 | 3;
          *(ulong *)(lVar29 + 8 + uVar14) = uVar18 | 1;
          *(ulong *)(lVar29 + uVar14 + uVar18) = uVar18;
          if (uVar8 != 0) {
            lVar28 = *(long *)((long)msp + 0x18);
            uVar8 = uVar8 >> 3;
            lVar13 = (long)msp + uVar8 * 0x10 + 0x38;
            if ((uVar15 >> ((uint)uVar8 & 0x1f) & 1) == 0) {
              *(uint *)msp = 1 << ((byte)uVar8 & 0x1f) | uVar15;
              lVar27 = lVar13;
            }
            else {
              lVar27 = *(long *)((long)msp + uVar8 * 0x10 + 0x48);
            }
            *(long *)((long)msp + uVar8 * 0x10 + 0x48) = lVar28;
            *(long *)(lVar27 + 0x18) = lVar28;
            *(long *)(lVar28 + 0x10) = lVar27;
            *(long *)(lVar28 + 0x18) = lVar13;
          }
          *(ulong *)((long)msp + 8) = uVar18;
          *(ulong *)((long)msp + 0x18) = lVar29 + uVar14;
        }
        goto LAB_0013b972;
      }
    }
  }
  else if (nsize < 0xffffffffffffff80) {
    uVar14 = nsize + 0xf & 0xfffffffffffffff8;
    uVar15 = *(uint *)((long)msp + 4);
    if (uVar15 != 0) {
      uVar17 = (uint)(nsize + 0xf >> 8);
      if (uVar17 == 0) {
        uVar8 = 0;
      }
      else if (uVar17 < 0x10000) {
        uVar24 = 0x1f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        uVar8 = (ulong)((uVar14 >> ((ulong)(byte)(0x26 - (char)(uVar24 ^ 0x1f)) & 0x3f) & 1) != 0) |
                (ulong)((uVar24 ^ 0x1f) * 2 ^ 0x3e);
      }
      else {
        uVar8 = 0x1f;
      }
      uVar18 = -uVar14;
      lVar29 = *(long *)((long)msp + uVar8 * 8 + 0x248);
      if (lVar29 == 0) {
        lVar28 = 0;
        lVar13 = 0;
      }
      else {
        bVar23 = 0x39 - (char)(uVar8 >> 1);
        if (uVar8 == 0x1f) {
          bVar23 = 0;
        }
        lVar27 = uVar14 << (bVar23 & 0x3f);
        lVar28 = 0;
        lVar13 = 0;
        do {
          uVar25 = (*(ulong *)(lVar29 + 8) & 0xfffffffffffffffc) - uVar14;
          if ((uVar25 < uVar18) && (uVar18 = uVar25, lVar13 = lVar29, uVar25 == 0)) {
            uVar18 = 0;
            lVar28 = lVar29;
            goto LAB_0013c05e;
          }
          lVar22 = *(long *)(lVar29 + 0x28);
          lVar29 = *(long *)(lVar29 + 0x20 + (lVar27 >> 0x3f) * -8);
          lVar30 = lVar22;
          if (lVar22 == lVar29) {
            lVar30 = lVar28;
          }
          if (lVar22 != 0) {
            lVar28 = lVar30;
          }
          lVar27 = lVar27 * 2;
        } while (lVar29 != 0);
      }
      lVar29 = lVar13;
      if (lVar28 != 0 || lVar29 != 0) goto LAB_0013c05e;
      uVar17 = 2 << ((byte)uVar8 & 0x1f);
      uVar17 = (-uVar17 | uVar17) & uVar15;
      if (uVar17 == 0) {
        lVar29 = 0;
        lVar28 = 0;
        goto LAB_0013c05e;
      }
      uVar24 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
        }
      }
      plVar21 = (long *)((long)msp + (ulong)uVar24 * 8 + 0x248);
      lVar29 = 0;
LAB_0013c05b:
      lVar28 = *plVar21;
LAB_0013c05e:
      while (lVar13 = lVar28, lVar13 != 0) {
        uVar8 = (*(ulong *)(lVar13 + 8) & 0xfffffffffffffffc) - uVar14;
        bVar31 = uVar8 < uVar18;
        if (bVar31) {
          uVar18 = uVar8;
        }
        if (bVar31) {
          lVar29 = lVar13;
        }
        lVar28 = *(long *)(lVar13 + 0x20);
        if (*(long *)(lVar13 + 0x20) == 0) goto code_r0x0013c085;
      }
      if ((lVar29 == 0) || (*(long *)((long)msp + 8) - uVar14 <= uVar18)) goto LAB_0013b85c;
      lVar28 = *(long *)(lVar29 + 0x18);
      lVar13 = *(long *)(lVar29 + 0x30);
      if (lVar28 != lVar29) {
        lVar27 = *(long *)(lVar29 + 0x10);
        *(long *)(lVar27 + 0x18) = lVar28;
        *(long *)(lVar28 + 0x10) = lVar27;
        goto LAB_0013c103;
      }
      if (*(long *)(lVar29 + 0x28) != 0) {
        lVar27 = *(long *)(lVar29 + 0x28);
        puVar20 = (undefined8 *)(lVar29 + 0x28);
        goto LAB_0013c0df;
      }
      if (*(long *)(lVar29 + 0x20) == 0) {
        lVar28 = 0;
      }
      else {
        lVar27 = *(long *)(lVar29 + 0x20);
        puVar20 = (undefined8 *)(lVar29 + 0x20);
LAB_0013c0df:
        do {
          do {
            puVar26 = puVar20;
            lVar28 = lVar27;
            lVar27 = *(long *)(lVar28 + 0x28);
            puVar20 = (undefined8 *)(lVar28 + 0x28);
          } while (*(long *)(lVar28 + 0x28) != 0);
          lVar27 = *(long *)(lVar28 + 0x20);
          puVar20 = (undefined8 *)(lVar28 + 0x20);
        } while (*(long *)(lVar28 + 0x20) != 0);
        *puVar26 = 0;
      }
LAB_0013c103:
      if (lVar13 != 0) {
        lVar27 = *(long *)(lVar29 + 0x38);
        if (lVar29 == *(long *)((long)msp + lVar27 * 8 + 0x248)) {
          *(long *)((long)msp + lVar27 * 8 + 0x248) = lVar28;
          if (lVar28 != 0) goto LAB_0013c131;
          *(uint *)((long)msp + 4) = uVar15 & ~(1 << ((uint)lVar27 & 0x1f));
        }
        else {
          *(long *)(lVar13 + 0x20 + (ulong)(*(long *)(lVar13 + 0x20) != lVar29) * 8) = lVar28;
          if (lVar28 != 0) {
LAB_0013c131:
            *(long *)(lVar28 + 0x30) = lVar13;
            lVar13 = *(long *)(lVar29 + 0x20);
            if (lVar13 != 0) {
              *(long *)(lVar28 + 0x20) = lVar13;
              *(long *)(lVar13 + 0x30) = lVar28;
            }
            lVar13 = *(long *)(lVar29 + 0x28);
            if (lVar13 != 0) {
              *(long *)(lVar28 + 0x28) = lVar13;
              *(long *)(lVar13 + 0x30) = lVar28;
            }
          }
        }
      }
      if (uVar18 < 0x20) {
        *(ulong *)(lVar29 + 8) = uVar18 + uVar14 | 3;
        pbVar2 = (byte *)(lVar29 + 8 + uVar18 + uVar14);
        *pbVar2 = *pbVar2 | 1;
      }
      else {
        lVar28 = lVar29 + uVar14;
        *(ulong *)(lVar29 + 8) = uVar14 | 3;
        *(ulong *)(lVar29 + 8 + uVar14) = uVar18 | 1;
        *(ulong *)(lVar28 + uVar18) = uVar18;
        if (uVar18 < 0x100) {
          uVar18 = uVar18 >> 3;
          lVar13 = (long)msp + uVar18 * 0x10 + 0x38;
          if ((*msp >> ((uint)uVar18 & 0x1f) & 1) == 0) {
            *(uint *)msp = *msp | 1 << ((byte)uVar18 & 0x1f);
            lVar27 = lVar13;
          }
          else {
            lVar27 = *(long *)((long)msp + uVar18 * 0x10 + 0x48);
          }
          *(long *)((long)msp + uVar18 * 0x10 + 0x48) = lVar28;
          *(long *)(lVar27 + 0x18) = lVar28;
          *(long *)(lVar28 + 0x10) = lVar27;
          *(long *)(lVar28 + 0x18) = lVar13;
        }
        else {
          uVar15 = (uint)(uVar18 >> 8);
          if (uVar15 == 0) {
            uVar14 = 0;
          }
          else if (uVar15 < 0x10000) {
            uVar17 = 0x1f;
            if (uVar15 != 0) {
              for (; uVar15 >> uVar17 == 0; uVar17 = uVar17 - 1) {
              }
            }
            uVar14 = (ulong)((uint)((uVar18 >> ((ulong)(byte)(0x26 - (char)(uVar17 ^ 0x1f)) & 0x3f)
                                    & 1) != 0) | (uVar17 ^ 0x1f) * 2 ^ 0x3e);
          }
          else {
            uVar14 = 0x1f;
          }
          plVar21 = (long *)((long)msp + uVar14 * 8 + 0x248);
          *(ulong *)(lVar28 + 0x38) = uVar14;
          *(undefined1 (*) [16])(lVar28 + 0x20) = (undefined1  [16])0x0;
          if ((*(uint *)((long)msp + 4) >> ((uint)uVar14 & 0x1f) & 1) == 0) {
            *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar14 & 0x1f);
            *plVar21 = lVar28;
            *(long **)(lVar28 + 0x30) = plVar21;
          }
          else {
            bVar23 = 0x39 - (char)(uVar14 >> 1);
            if (uVar14 == 0x1f) {
              bVar23 = 0;
            }
            lVar27 = uVar18 << (bVar23 & 0x3f);
            lVar13 = *plVar21;
            do {
              lVar22 = lVar13;
              if ((*(ulong *)(lVar22 + 8) & 0xfffffffffffffffc) == uVar18) {
                lVar13 = *(long *)(lVar22 + 0x10);
                *(long *)(lVar13 + 0x18) = lVar28;
                *(long *)(lVar22 + 0x10) = lVar28;
                *(long *)(lVar28 + 0x10) = lVar13;
                *(long *)(lVar28 + 0x18) = lVar22;
                *(undefined8 *)(lVar28 + 0x30) = 0;
                goto LAB_0013b972;
              }
              lVar30 = lVar27 >> 0x3f;
              lVar27 = lVar27 * 2;
              lVar13 = *(long *)(lVar22 + 0x20 + lVar30 * -8);
            } while (lVar13 != 0);
            *(long *)(lVar22 + 0x20 + lVar30 * -8) = lVar28;
            *(long *)(lVar28 + 0x30) = lVar22;
          }
          *(long *)(lVar28 + 0x18) = lVar28;
          *(long *)(lVar28 + 0x10) = lVar28;
        }
      }
      goto LAB_0013b972;
    }
  }
  else {
    uVar14 = 0xffffffffffffffff;
  }
LAB_0013b85c:
  uVar8 = *(ulong *)((long)msp + 8);
  uVar18 = uVar8 - uVar14;
  if (uVar14 <= uVar8) {
    lVar29 = *(long *)((long)msp + 0x18);
    if (uVar18 < 0x20) {
      *(ulong *)(lVar29 + 8) = uVar8 | 3;
      pbVar2 = (byte *)(lVar29 + 8 + uVar8);
      *pbVar2 = *pbVar2 | 1;
      lVar28 = 0;
      uVar18 = 0;
    }
    else {
      lVar28 = lVar29 + uVar14;
      *(ulong *)(lVar29 + 8 + uVar14) = uVar18 | 1;
      *(ulong *)(lVar29 + uVar8) = uVar18;
      *(ulong *)(lVar29 + 8) = uVar14 | 3;
    }
    *(long *)((long)msp + 0x18) = lVar28;
    *(ulong *)((long)msp + 8) = uVar18;
    goto LAB_0013b972;
  }
  uVar8 = *(ulong *)((long)msp + 0x10) - uVar14;
  if (*(ulong *)((long)msp + 0x10) < uVar14 || uVar8 == 0) {
    if ((0x1ffff < uVar14) && (uVar8 = uVar14 + 0x1036 & 0xfffffffffffff000, uVar14 < uVar8)) {
      piVar9 = __errno_location();
      iVar3 = *piVar9;
      pvVar10 = mmap64((void *)0x0,uVar8,3,0x62,-1,0);
      *piVar9 = iVar3;
      if (pvVar10 != (void *)0xffffffffffffffff) {
        uVar14 = (ulong)(-(int)pvVar10 - 0x10U & 7);
        *(ulong *)((long)pvVar10 + uVar14) = uVar14 | 1;
        *(ulong *)((long)pvVar10 + uVar14 + 8) = (uVar8 - uVar14) - 0x20 | 2;
        *(undefined8 *)((long)pvVar10 + (uVar8 - uVar14) + -0x18 + uVar14) = 0xb;
        *(undefined8 *)((long)pvVar10 + (uVar8 - 0x10)) = 0;
        return (void *)((long)pvVar10 + uVar14 + 0x10);
      }
    }
    uVar8 = uVar14 + 0x20040 & 0xfffffffffffe0000;
    if (uVar8 <= uVar14) {
      return (void *)0x0;
    }
    piVar9 = __errno_location();
    iVar3 = *piVar9;
    pvVar10 = mmap64((void *)0x0,uVar8,3,0x62,-1,0);
    *piVar9 = iVar3;
    if (pvVar10 == (void *)0xffffffffffffffff) {
      return (void *)0x0;
    }
    puVar1 = (ulong *)((long)msp + 0x348);
    for (puVar11 = puVar1; puVar11 != (ulong *)0x0; puVar11 = (ulong *)puVar11[2]) {
      if (pvVar10 == (void *)((long)*puVar11 + puVar11[1])) {
        pvVar4 = *(void **)((long)msp + 0x20);
        if (((void *)*puVar11 <= pvVar4) && (pvVar4 < pvVar10)) {
          puVar11[1] = puVar11[1] + uVar8;
          lVar29 = uVar8 + *(long *)((long)msp + 0x10);
          uVar18 = (ulong)(-(int)pvVar4 - 0x10U & 7);
          uVar8 = lVar29 - uVar18;
          *(ulong *)((long)msp + 0x20) = (long)pvVar4 + uVar18;
          *(ulong *)((long)msp + 0x10) = uVar8;
          *(ulong *)((long)pvVar4 + uVar18 + 8) = uVar8 | 1;
          *(undefined8 *)((long)pvVar4 + lVar29 + 8) = 0x40;
          *(undefined8 *)((long)msp + 0x28) = 0x200000;
          goto LAB_0013bd66;
        }
        break;
      }
    }
    puVar11 = puVar1;
    while( true ) {
      if (puVar11 == (ulong *)0x0) goto LAB_0013b9fb;
      uVar18 = *puVar11;
      if (uVar18 == (long)pvVar10 + uVar8) break;
      puVar11 = (ulong *)puVar11[2];
    }
    *puVar11 = (ulong)pvVar10;
    puVar11[1] = puVar11[1] + uVar8;
    uVar25 = (ulong)(-(int)pvVar10 - 0x10U & 7);
    lVar28 = (-(int)uVar18 - 0x10U & 7) + uVar18;
    lVar29 = (long)pvVar10 + uVar14 + uVar25;
    uVar8 = lVar28 - lVar29;
    *(ulong *)((long)pvVar10 + uVar25 + 8) = uVar14 | 3;
    if (lVar28 == *(long *)((long)msp + 0x20)) {
      uVar8 = uVar8 + *(long *)((long)msp + 0x10);
      *(ulong *)((long)msp + 0x10) = uVar8;
      *(long *)((long)msp + 0x20) = lVar29;
      *(ulong *)(lVar29 + 8) = uVar8 | 1;
      goto LAB_0013bfb9;
    }
    if (lVar28 == *(long *)((long)msp + 0x18)) {
      uVar8 = uVar8 + *(long *)((long)msp + 8);
      *(ulong *)((long)msp + 8) = uVar8;
      *(long *)((long)msp + 0x18) = lVar29;
      *(ulong *)(lVar29 + 8) = uVar8 | 1;
      *(ulong *)(lVar29 + uVar8) = uVar8;
      goto LAB_0013bfb9;
    }
    uVar14 = *(ulong *)(lVar28 + 8);
    if ((uVar14 & 2) != 0) goto LAB_0013be6a;
    uVar18 = uVar14 & 0xfffffffffffffffc;
    lVar13 = *(long *)(lVar28 + 0x18);
    if (uVar14 < 0x100) {
      lVar27 = *(long *)(lVar28 + 0x10);
      if (lVar27 == lVar13) {
        bVar23 = (byte)(uVar14 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar23 | 0xfffffffeU >> 0x20 - bVar23);
      }
      else {
        *(long *)(lVar27 + 0x18) = lVar13;
        *(long *)(lVar13 + 0x10) = lVar27;
      }
      goto LAB_0013be5f;
    }
    lVar27 = *(long *)(lVar28 + 0x30);
    if (lVar13 != lVar28) {
      lVar22 = *(long *)(lVar28 + 0x10);
      *(long *)(lVar22 + 0x18) = lVar13;
      *(long *)(lVar13 + 0x10) = lVar22;
      goto LAB_0013bdf9;
    }
    if (*(long *)(lVar28 + 0x28) != 0) {
      lVar22 = *(long *)(lVar28 + 0x28);
      puVar20 = (undefined8 *)(lVar28 + 0x28);
      goto LAB_0013bdd5;
    }
    if (*(long *)(lVar28 + 0x20) == 0) {
      lVar13 = 0;
    }
    else {
      lVar22 = *(long *)(lVar28 + 0x20);
      puVar20 = (undefined8 *)(lVar28 + 0x20);
LAB_0013bdd5:
      do {
        do {
          puVar26 = puVar20;
          lVar13 = lVar22;
          lVar22 = *(long *)(lVar13 + 0x28);
          puVar20 = (undefined8 *)(lVar13 + 0x28);
        } while (*(long *)(lVar13 + 0x28) != 0);
        lVar22 = *(long *)(lVar13 + 0x20);
        puVar20 = (undefined8 *)(lVar13 + 0x20);
      } while (*(long *)(lVar13 + 0x20) != 0);
      *puVar26 = 0;
    }
LAB_0013bdf9:
    if (lVar27 != 0) {
      lVar22 = *(long *)(lVar28 + 0x38);
      if (lVar28 == *(long *)((long)msp + lVar22 * 8 + 0x248)) {
        *(long *)((long)msp + lVar22 * 8 + 0x248) = lVar13;
        if (lVar13 == 0) {
          bVar23 = (byte)lVar22 & 0x1f;
          *(uint *)((long)msp + 4) =
               *(uint *)((long)msp + 4) & (-2 << bVar23 | 0xfffffffeU >> 0x20 - bVar23);
          goto LAB_0013be5f;
        }
      }
      else {
        *(long *)(lVar27 + 0x20 + (ulong)(*(long *)(lVar27 + 0x20) != lVar28) * 8) = lVar13;
        if (lVar13 == 0) goto LAB_0013be5f;
      }
      *(long *)(lVar13 + 0x30) = lVar27;
      lVar27 = *(long *)(lVar28 + 0x20);
      if (lVar27 != 0) {
        *(long *)(lVar13 + 0x20) = lVar27;
        *(long *)(lVar27 + 0x30) = lVar13;
      }
      lVar27 = *(long *)(lVar28 + 0x28);
      if (lVar27 != 0) {
        *(long *)(lVar13 + 0x28) = lVar27;
        *(long *)(lVar27 + 0x30) = lVar13;
      }
    }
LAB_0013be5f:
    uVar14 = *(ulong *)(lVar28 + 8 + uVar18);
    lVar28 = lVar28 + uVar18;
    uVar8 = uVar8 + uVar18;
LAB_0013be6a:
    *(ulong *)(lVar28 + 8) = uVar14 & 0xfffffffffffffffe;
    *(ulong *)(lVar29 + 8) = uVar8 | 1;
    *(ulong *)(lVar29 + uVar8) = uVar8;
    if (uVar8 < 0x100) {
      uVar8 = uVar8 >> 3;
      lVar28 = (long)msp + uVar8 * 0x10 + 0x38;
      if ((*msp >> ((uint)uVar8 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar8 & 0x1f);
        lVar13 = lVar28;
      }
      else {
        lVar13 = *(long *)((long)msp + uVar8 * 0x10 + 0x48);
      }
      *(long *)((long)msp + uVar8 * 0x10 + 0x48) = lVar29;
      *(long *)(lVar13 + 0x18) = lVar29;
      *(long *)(lVar29 + 0x10) = lVar13;
      *(long *)(lVar29 + 0x18) = lVar28;
    }
    else {
      uVar15 = (uint)(uVar8 >> 8);
      if (uVar15 == 0) {
        uVar14 = 0;
      }
      else if (uVar15 < 0x10000) {
        uVar17 = 0x1f;
        if (uVar15 != 0) {
          for (; uVar15 >> uVar17 == 0; uVar17 = uVar17 - 1) {
          }
        }
        uVar14 = (ulong)((uint)((uVar8 >> ((ulong)(byte)(0x26 - (char)(uVar17 ^ 0x1f)) & 0x3f) & 1)
                               != 0) | (uVar17 ^ 0x1f) * 2 ^ 0x3e);
      }
      else {
        uVar14 = 0x1f;
      }
      plVar21 = (long *)(uVar14 * 8 + 0x248 + (long)msp);
      *(ulong *)(lVar29 + 0x38) = uVar14;
      *(undefined1 (*) [16])(lVar29 + 0x20) = (undefined1  [16])0x0;
      if ((*(uint *)((long)msp + 4) >> ((uint)uVar14 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar14 & 0x1f);
        *plVar21 = lVar29;
        *(long **)(lVar29 + 0x30) = plVar21;
      }
      else {
        bVar23 = 0x39 - (char)(uVar14 >> 1);
        if (uVar14 == 0x1f) {
          bVar23 = 0;
        }
        lVar13 = uVar8 << (bVar23 & 0x3f);
        lVar28 = *plVar21;
        do {
          lVar27 = lVar28;
          if ((*(ulong *)(lVar27 + 8) & 0xfffffffffffffffc) == uVar8) {
            lVar28 = *(long *)(lVar27 + 0x10);
            *(long *)(lVar28 + 0x18) = lVar29;
            *(long *)(lVar27 + 0x10) = lVar29;
            *(long *)(lVar29 + 0x10) = lVar28;
            *(long *)(lVar29 + 0x18) = lVar27;
            *(undefined8 *)(lVar29 + 0x30) = 0;
            goto LAB_0013bfb9;
          }
          lVar22 = lVar13 >> 0x3f;
          lVar13 = lVar13 * 2;
          lVar28 = *(long *)(lVar27 + 0x20 + lVar22 * -8);
        } while (lVar28 != 0);
        *(long *)(lVar27 + 0x20 + lVar22 * -8) = lVar29;
        *(long *)(lVar29 + 0x30) = lVar27;
      }
      *(long *)(lVar29 + 0x18) = lVar29;
      *(long *)(lVar29 + 0x10) = lVar29;
    }
LAB_0013bfb9:
    return (void *)((long)pvVar10 + uVar25 + 0x10);
  }
  *(ulong *)((long)msp + 0x10) = uVar8;
  lVar29 = *(long *)((long)msp + 0x20);
  *(ulong *)((long)msp + 0x20) = lVar29 + uVar14;
  goto LAB_0013b881;
code_r0x0013c085:
  plVar21 = (long *)(lVar13 + 0x28);
  goto LAB_0013c05b;
LAB_0013b9fb:
  addr = *(undefined1 (**) [16])((long)msp + 0x20);
  pmVar12 = segment_holding((mstate)msp,(char *)addr);
  pauVar19 = (undefined1 (*) [16])(pmVar12->base + pmVar12->size);
  pauVar16 = (undefined1 (*) [16])(pauVar19[-5] + (ulong)(0x37U - (int)pauVar19 & 7) + 9);
  if ((undefined1 (*) [16])(pauVar19[-5] + (ulong)(0x37U - (int)pauVar19 & 7) + 9) < addr + 2) {
    pauVar16 = addr;
  }
  uVar25 = (ulong)(-(int)pvVar10 - 0x10U & 7);
  uVar18 = (uVar8 - 0x40) - uVar25;
  *(ulong *)((long)msp + 0x20) = (long)pvVar10 + uVar25;
  *(ulong *)((long)msp + 0x10) = uVar18;
  *(ulong *)((long)pvVar10 + uVar25 + 8) = uVar18 | 1;
  *(undefined8 *)((long)pvVar10 + (uVar8 - 0x38)) = 0x40;
  *(undefined8 *)((long)msp + 0x28) = 0x200000;
  *(undefined8 *)(*pauVar16 + 8) = 0x23;
  uVar5 = *(undefined8 *)((long)msp + 0x350);
  *(ulong *)pauVar16[1] = *puVar1;
  *(undefined8 *)(pauVar16[1] + 8) = uVar5;
  *(undefined8 *)pauVar16[2] = *(undefined8 *)((long)msp + 0x358);
  *(void **)((long)msp + 0x348) = pvVar10;
  *(ulong *)((long)msp + 0x350) = uVar8;
  *(undefined1 (**) [16])((long)msp + 0x358) = pauVar16 + 1;
  auVar7 = _DAT_0014f220;
  auVar6 = _DAT_0014f210;
  if (pauVar19 <= pauVar16 + 3) {
    pauVar19 = pauVar16 + 3;
  }
  uVar18 = (long)pauVar19 + (-0x29 - (long)pauVar16);
  auVar34._8_4_ = (int)uVar18;
  auVar34._0_8_ = uVar18;
  auVar34._12_4_ = (int)(uVar18 >> 0x20);
  auVar32._0_8_ = uVar18 >> 3;
  auVar32._8_8_ = auVar34._8_8_ >> 3;
  uVar8 = 0;
  auVar32 = auVar32 ^ _DAT_0014f220;
  do {
    auVar33._8_4_ = (int)uVar8;
    auVar33._0_8_ = uVar8;
    auVar33._12_4_ = (int)(uVar8 >> 0x20);
    auVar34 = (auVar33 | auVar6) ^ auVar7;
    if ((bool)(~(auVar34._4_4_ == auVar32._4_4_ && auVar32._0_4_ < auVar34._0_4_ ||
                auVar32._4_4_ < auVar34._4_4_) & 1)) {
      *(undefined8 *)(pauVar16[2] + uVar8 * 8 + 8) = 0xb;
    }
    if ((auVar34._12_4_ != auVar32._12_4_ || auVar34._8_4_ <= auVar32._8_4_) &&
        auVar34._12_4_ <= auVar32._12_4_) {
      *(undefined8 *)(pauVar16[3] + uVar8 * 8) = 0xb;
    }
    uVar8 = uVar8 + 2;
  } while (((uVar18 >> 3) + 2 & 0xfffffffffffffffe) != uVar8);
  uVar8 = (long)pauVar16 - (long)addr;
  if (uVar8 != 0) {
    (*pauVar16)[8] = (*pauVar16)[8] & 0xfe;
    *(ulong *)(*addr + 8) = uVar8 | 1;
    *(ulong *)*pauVar16 = uVar8;
    if (uVar8 < 0x100) {
      uVar8 = uVar8 >> 3;
      pauVar16 = (undefined1 (*) [16])((long)msp + uVar8 * 0x10 + 0x38);
      if ((*msp >> ((uint)uVar8 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar8 & 0x1f);
        pauVar19 = pauVar16;
      }
      else {
        pauVar19 = *(undefined1 (**) [16])((long)msp + uVar8 * 0x10 + 0x48);
      }
      *(undefined1 (**) [16])((long)msp + uVar8 * 0x10 + 0x48) = addr;
      *(undefined1 (**) [16])(pauVar19[1] + 8) = addr;
      lVar29 = 0x18;
      lVar28 = 0x10;
    }
    else {
      uVar15 = (uint)(uVar8 >> 8);
      if (uVar15 == 0) {
        uVar18 = 0;
      }
      else if (uVar15 < 0x10000) {
        uVar17 = 0x1f;
        if (uVar15 != 0) {
          for (; uVar15 >> uVar17 == 0; uVar17 = uVar17 - 1) {
          }
        }
        uVar18 = (ulong)((uint)((uVar8 >> ((ulong)(byte)(0x26 - (char)(uVar17 ^ 0x1f)) & 0x3f) & 1)
                               != 0) | (uVar17 ^ 0x1f) * 2 ^ 0x3e);
      }
      else {
        uVar18 = 0x1f;
      }
      puVar20 = (undefined8 *)(uVar18 * 8 + 0x248 + (long)msp);
      *(ulong *)(addr[3] + 8) = uVar18;
      addr[2] = (undefined1  [16])0x0;
      if ((*(uint *)((long)msp + 4) >> ((uint)uVar18 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar18 & 0x1f);
        *puVar20 = addr;
        *(undefined8 **)addr[3] = puVar20;
      }
      else {
        bVar23 = 0x39 - (char)(uVar18 >> 1);
        if (uVar18 == 0x1f) {
          bVar23 = 0;
        }
        lVar29 = uVar8 << (bVar23 & 0x3f);
        pauVar16 = (undefined1 (*) [16])*puVar20;
        do {
          pauVar19 = pauVar16;
          if ((*(ulong *)(*pauVar19 + 8) & 0xfffffffffffffffc) == uVar8) {
            lVar29 = *(long *)pauVar19[1];
            *(undefined1 (**) [16])(lVar29 + 0x18) = addr;
            *(undefined1 (**) [16])pauVar19[1] = addr;
            *(long *)addr[1] = lVar29;
            lVar29 = 0x30;
            lVar28 = 0x18;
            pauVar16 = (undefined1 (*) [16])0x0;
            goto LAB_0013bd5e;
          }
          lVar28 = lVar29 >> 0x3f;
          lVar29 = lVar29 * 2;
          pauVar16 = *(undefined1 (**) [16])((long)pauVar19 + lVar28 * -8 + 0x20);
        } while (pauVar16 != (undefined1 (*) [16])0x0);
        *(undefined1 (**) [16])((long)pauVar19 + lVar28 * -8 + 0x20) = addr;
        *(undefined1 (**) [16])addr[3] = pauVar19;
      }
      lVar29 = 0x10;
      lVar28 = 0x18;
      pauVar19 = addr;
      pauVar16 = addr;
    }
LAB_0013bd5e:
    *(undefined1 (**) [16])(*addr + lVar28) = pauVar19;
    *(undefined1 (**) [16])(*addr + lVar29) = pauVar16;
  }
LAB_0013bd66:
  uVar8 = *(ulong *)((long)msp + 0x10) - uVar14;
  if (*(ulong *)((long)msp + 0x10) < uVar14 || uVar8 == 0) {
    return (void *)0x0;
  }
  *(ulong *)((long)msp + 0x10) = uVar8;
  lVar29 = *(long *)((long)msp + 0x20);
  *(ulong *)((long)msp + 0x20) = lVar29 + uVar14;
LAB_0013b881:
  *(ulong *)(lVar29 + 8 + uVar14) = uVar8 | 1;
  *(ulong *)(lVar29 + 8) = uVar14 | 3;
LAB_0013b972:
  return (void *)(lVar29 + 0x10);
}

Assistant:

static LJ_NOINLINE void *lj_alloc_malloc(void *msp, size_t nsize)
{
  mstate ms = (mstate)msp;
  void *mem;
  size_t nb;
  if (nsize <= MAX_SMALL_REQUEST) {
    bindex_t idx;
    binmap_t smallbits;
    nb = (nsize < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(nsize);
    idx = small_index(nb);
    smallbits = ms->smallmap >> idx;

    if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
      mchunkptr b, p;
      idx += ~smallbits & 1;       /* Uses next bin if idx empty */
      b = smallbin_at(ms, idx);
      p = b->fd;
      unlink_first_small_chunk(ms, b, p, idx);
      set_inuse_and_pinuse(ms, p, small_index2size(idx));
      mem = chunk2mem(p);
      return mem;
    } else if (nb > ms->dvsize) {
      if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
	mchunkptr b, p, r;
	size_t rsize;
	binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
	bindex_t i = lj_ffs(leftbits);
	b = smallbin_at(ms, i);
	p = b->fd;
	unlink_first_small_chunk(ms, b, p, i);
	rsize = small_index2size(i) - nb;
	/* Fit here cannot be remainderless if 4byte sizes */
	if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE) {
	  set_inuse_and_pinuse(ms, p, small_index2size(i));
	} else {
	  set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
	  r = chunk_plus_offset(p, nb);
	  set_size_and_pinuse_of_free_chunk(r, rsize);
	  replace_dv(ms, r, rsize);
	}
	mem = chunk2mem(p);
	return mem;
      } else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
	return mem;
      }
    }
  } else if (nsize >= MAX_REQUEST) {
    nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
  } else {
    nb = pad_request(nsize);
    if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
      return mem;
    }
  }

  if (nb <= ms->dvsize) {
    size_t rsize = ms->dvsize - nb;
    mchunkptr p = ms->dv;
    if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
      mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
      ms->dvsize = rsize;
      set_size_and_pinuse_of_free_chunk(r, rsize);
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    } else { /* exhaust dv */
      size_t dvs = ms->dvsize;
      ms->dvsize = 0;
      ms->dv = 0;
      set_inuse_and_pinuse(ms, p, dvs);
    }
    mem = chunk2mem(p);
    return mem;
  } else if (nb < ms->topsize) { /* Split top */
    size_t rsize = ms->topsize -= nb;
    mchunkptr p = ms->top;
    mchunkptr r = ms->top = chunk_plus_offset(p, nb);
    r->head = rsize | PINUSE_BIT;
    set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    mem = chunk2mem(p);
    return mem;
  }
  return alloc_sys(ms, nb);
}